

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_engine.cpp
# Opt level: O0

int __thiscall zmq::udp_engine_t::init(udp_engine_t *this,EVP_PKEY_CTX *ctx)

{
  fd_t fVar1;
  byte in_CL;
  byte in_DL;
  undefined4 in_stack_ffffffffffffffd4;
  uint s_;
  int in_stack_ffffffffffffffe0;
  int local_4;
  
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","address_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/udp_engine.cpp"
            ,0x58);
    fflush(_stderr);
    zmq_abort((char *)0x30e971);
  }
  s_ = CONCAT13(1,(int3)in_stack_ffffffffffffffd4);
  if ((bool)(in_DL & 1) == false) {
    s_ = CONCAT13(in_CL,(int3)in_stack_ffffffffffffffd4) & 0x1ffffff;
  }
  if ((((byte)(s_ >> 0x18) ^ 0xff) & 1) != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","send_ || recv_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/udp_engine.cpp"
            ,0x59);
    fflush(_stderr);
    zmq_abort((char *)0x30e9dd);
  }
  this->_send_enabled = (bool)(in_DL & 1);
  this->_recv_enabled = (bool)(in_CL & 1);
  this->_address = (address_t *)ctx;
  udp_address_t::family((udp_address_t *)0x30ea14);
  fVar1 = open_socket(in_stack_ffffffffffffffe0,(int)((ulong)this >> 0x20),(int)this);
  this->_fd = fVar1;
  if (this->_fd == -1) {
    local_4 = -1;
  }
  else {
    unblock_socket(s_);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int zmq::udp_engine_t::init (address_t *address_, bool send_, bool recv_)
{
    zmq_assert (address_);
    zmq_assert (send_ || recv_);
    _send_enabled = send_;
    _recv_enabled = recv_;
    _address = address_;

    _fd = open_socket (_address->resolved.udp_addr->family (), SOCK_DGRAM,
                       IPPROTO_UDP);
    if (_fd == retired_fd)
        return -1;

    unblock_socket (_fd);

    return 0;
}